

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_query * __thiscall
pugi::xpath_query::evaluate_string_abi_cxx11_(xpath_query *this,xpath_node *n)

{
  bad_alloc *this_00;
  char_t *pcVar1;
  size_t sVar2;
  xpath_node *in_RDX;
  allocator local_20cd [13];
  undefined1 local_20c0 [8];
  xpath_string r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_node *n_local;
  xpath_query *this_local;
  
  if ((n->_node)._root == (xml_node_struct *)0x0) {
    std::__cxx11::string::string((string *)this);
  }
  else {
    impl::anon_unknown_0::xpath_context::xpath_context((xpath_context *)&sd.oom,in_RDX,1,1);
    impl::anon_unknown_0::xpath_stack_data::xpath_stack_data((xpath_stack_data *)&r._length_heap);
    impl::anon_unknown_0::xpath_ast_node::eval_string
              ((xpath_string *)local_20c0,(xpath_ast_node *)((n->_node)._root)->header,
               (xpath_context *)&sd.oom,(xpath_stack *)&sd.temp._error);
    if (((byte)sd.stack.temp & 1) != 0) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pcVar1 = impl::anon_unknown_0::xpath_string::c_str((xpath_string *)local_20c0);
    sVar2 = impl::anon_unknown_0::xpath_string::length((xpath_string *)local_20c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,(char *)pcVar1,sVar2,local_20cd);
    std::allocator<char>::~allocator((allocator<char> *)local_20cd);
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data((xpath_stack_data *)&r._length_heap);
  }
  return this;
}

Assistant:

PUGI__FN string_t xpath_query::evaluate_string(const xpath_node& n) const
	{
		if (!_impl) return string_t();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_string r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_string(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return string_t();
		#else
			throw std::bad_alloc();
		#endif
		}

		return string_t(r.c_str(), r.length());
	}